

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr-writer-test.cc
# Opt level: O2

void __thiscall
ExprWriterTest_VarArgExprPrecedence_Test::ExprWriterTest_VarArgExprPrecedence_Test
          (ExprWriterTest_VarArgExprPrecedence_Test *this)

{
  ExprWriterTest::ExprWriterTest(&this->super_ExprWriterTest);
  (this->super_ExprWriterTest).super_Test._vptr_Test = (_func_int **)&PTR__ExprWriterTest_0016c7c8;
  (this->super_ExprWriterTest).super_ExprFactory._vptr_BasicExprFactory =
       (_func_int **)&PTR__ExprWriterTest_VarArgExprPrecedence_Test_0016c808;
  return;
}

Assistant:

TEST_F(ExprWriterTest, VarArgExprPrecedence) {
  NumericExpr x1 = MakeVariable(0), x2 = MakeVariable(1);
  NumericExpr e = MakeBinary(ex::ADD, x1, x2);
  NumericExpr args[] = {e, e};
  CHECK_WRITE("min(x1 + x2, x1 + x2)", MakeIterated(ex::MIN, args));
  CHECK_WRITE("max(x1 + x2, x1 + x2)", MakeIterated(ex::MAX, args));
  NumericExpr args2[] = {x1}, args3[] = {x2};
  NumericExpr args4[] = {
    MakeIterated(ex::MIN, args2), MakeIterated(ex::MIN, args3)
  };
  CHECK_WRITE("min(min(x1), min(x2))", MakeIterated(ex::MIN, args4));
  NumericExpr args5[] = {
    MakeIterated(ex::MAX, args2), MakeIterated(ex::MAX, args3)
  };
  CHECK_WRITE("max(max(x1), max(x2))", MakeIterated(ex::MAX, args5));
}